

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feefrac.cpp
# Opt level: O0

partial_ordering CompareChunks(Span<const_FeeFrac> chunks0,Span<const_FeeFrac> chunks1)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  FeeFrac FVar7;
  FeeFrac *point_b;
  FeeFrac *point_a;
  FeeFrac *point_p;
  int unproc_side;
  bool done_1;
  bool done_0;
  weak_ordering cmp;
  anon_class_24_3_20bf67a9 advance;
  anon_class_8_1_a79f59f9 prev_point;
  anon_class_24_3_8dde4389 next_point;
  FeeFrac slope_ab;
  FeeFrac slope_ap;
  bool better_somewhere [2];
  FeeFrac accum [2];
  size_t next_index [2];
  array<Span<const_FeeFrac>,_2UL> chunk;
  undefined4 in_stack_fffffffffffffdc8;
  int32_t in_stack_fffffffffffffdcc;
  undefined1 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd1;
  undefined1 in_stack_fffffffffffffdd2;
  undefined1 in_stack_fffffffffffffdd3;
  undefined1 uVar8;
  int in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddc;
  undefined1 in_stack_fffffffffffffddd;
  undefined1 in_stack_fffffffffffffdde;
  undefined1 uVar9;
  undefined1 in_stack_fffffffffffffddf;
  undefined1 **in_stack_fffffffffffffde0;
  int32_t in_stack_fffffffffffffde8;
  uint in_stack_fffffffffffffdec;
  size_t *local_1f0;
  undefined6 in_stack_fffffffffffffe18;
  partial_ordering in_stack_fffffffffffffe1e;
  partial_ordering in_stack_fffffffffffffe1f;
  FeeFrac *in_stack_fffffffffffffe20;
  undefined1 *local_120;
  size_t *local_118;
  byte *local_110;
  type local_e1;
  int64_t local_e0;
  int32_t local_d8;
  FeeFrac local_d0 [2];
  int64_t local_b0;
  int32_t local_a8;
  int64_t local_a0;
  int32_t local_98;
  int64_t local_90;
  int32_t local_88;
  int64_t local_80;
  int local_78;
  int64_t local_70;
  int32_t local_68;
  byte local_5a [2];
  size_t local_58 [4];
  size_t local_38;
  size_t local_30;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_38,0,0x10);
  local_1f0 = (size_t *)(local_5a + 2);
  do {
    FeeFrac::FeeFrac((FeeFrac *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_1f0 = local_1f0 + 2;
  } while (local_1f0 != &local_38);
  memset(local_5a,0,2);
  local_120 = local_28;
  local_118 = &local_38;
  local_110 = local_5a + 2;
  do {
    sVar4 = local_38;
    std::array<Span<const_FeeFrac>,_2UL>::operator[]
              ((array<Span<const_FeeFrac>,_2UL> *)
               CONCAT17(in_stack_fffffffffffffddf,
                        CONCAT16(in_stack_fffffffffffffdde,
                                 CONCAT15(in_stack_fffffffffffffddd,
                                          CONCAT14(in_stack_fffffffffffffddc,
                                                   in_stack_fffffffffffffdd8)))),
               CONCAT44(in_stack_fffffffffffffdd4,
                        CONCAT13(in_stack_fffffffffffffdd3,
                                 CONCAT12(in_stack_fffffffffffffdd2,
                                          CONCAT11(in_stack_fffffffffffffdd1,
                                                   in_stack_fffffffffffffdd0)))));
    sVar3 = Span<const_FeeFrac>::size
                      ((Span<const_FeeFrac> *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    sVar2 = local_30;
    bVar5 = sVar4 == sVar3;
    std::array<Span<const_FeeFrac>,_2UL>::operator[]
              ((array<Span<const_FeeFrac>,_2UL> *)
               CONCAT17(in_stack_fffffffffffffddf,
                        CONCAT16(in_stack_fffffffffffffdde,
                                 CONCAT15(in_stack_fffffffffffffddd,
                                          CONCAT14(in_stack_fffffffffffffddc,
                                                   in_stack_fffffffffffffdd8)))),
               CONCAT44(in_stack_fffffffffffffdd4,
                        CONCAT13(in_stack_fffffffffffffdd3,
                                 CONCAT12(in_stack_fffffffffffffdd2,
                                          CONCAT11(in_stack_fffffffffffffdd1,
                                                   in_stack_fffffffffffffdd0)))));
    sVar4 = Span<const_FeeFrac>::size
                      ((Span<const_FeeFrac> *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    bVar6 = sVar2 == sVar4;
    if ((bVar5) && (bVar6)) {
      uVar9 = 0xff;
      if ((local_5a[1] & 1) <= (local_5a[0] & 1)) {
        uVar9 = 1;
      }
      uVar8 = 0;
      if ((local_5a[0] & 1) != (local_5a[1] & 1)) {
        uVar8 = uVar9;
      }
      local_e1 = (type)std::strong_ordering::operator_cast_to_partial_ordering
                                 ((strong_ordering *)
                                  (ulong)(CONCAT14(local_5a[0],
                                                   CONCAT13(uVar8,CONCAT12(uVar9,CONCAT11(
                                                  in_stack_fffffffffffffdd1,
                                                  in_stack_fffffffffffffdd0)))) & 0x1ffffffff));
      goto LAB_01ab852a;
    }
    if ((bVar5) || (bVar6)) {
      in_stack_fffffffffffffdec = CONCAT13(bVar5,(int3)in_stack_fffffffffffffdec);
    }
    else {
      in_stack_fffffffffffffde0 = &local_120;
      FVar7 = CompareChunks::anon_class_24_3_8dde4389::operator()
                        ((anon_class_24_3_8dde4389 *)
                         CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                         (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
      local_70 = FVar7.fee;
      in_stack_fffffffffffffde8 = FVar7.size;
      local_68 = in_stack_fffffffffffffde8;
      FVar7 = CompareChunks::anon_class_24_3_8dde4389::operator()
                        ((anon_class_24_3_8dde4389 *)
                         CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                         (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
      local_80 = FVar7.fee;
      local_78 = FVar7.size;
      in_stack_fffffffffffffdec =
           CONCAT13(local_78 < in_stack_fffffffffffffde8,(int3)in_stack_fffffffffffffdec);
    }
    uVar1 = in_stack_fffffffffffffdec >> 0x18;
    FVar7 = CompareChunks::anon_class_24_3_8dde4389::operator()
                      ((anon_class_24_3_8dde4389 *)
                       CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                       (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
    local_90 = FVar7.fee;
    local_88 = FVar7.size;
    FVar7 = CompareChunks::anon_class_8_1_a79f59f9::operator()
                      ((anon_class_8_1_a79f59f9 *)
                       CONCAT17(in_stack_fffffffffffffddf,
                                CONCAT16(in_stack_fffffffffffffdde,
                                         CONCAT15(in_stack_fffffffffffffddd,
                                                  CONCAT14(in_stack_fffffffffffffddc,
                                                           in_stack_fffffffffffffdd8)))),
                       in_stack_fffffffffffffdd4);
    local_a0 = FVar7.fee;
    local_98 = FVar7.size;
    FVar7 = operator-((FeeFrac *)
                      CONCAT17(in_stack_fffffffffffffddf,
                               CONCAT16(in_stack_fffffffffffffdde,
                                        CONCAT15(in_stack_fffffffffffffddd,
                                                 CONCAT14(in_stack_fffffffffffffddc,
                                                          in_stack_fffffffffffffdd8)))),
                      (FeeFrac *)
                      CONCAT44(in_stack_fffffffffffffdd4,
                               CONCAT13(in_stack_fffffffffffffdd3,
                                        CONCAT12(in_stack_fffffffffffffdd2,
                                                 CONCAT11(in_stack_fffffffffffffdd1,
                                                          in_stack_fffffffffffffdd0)))));
    local_b0 = FVar7.fee;
    local_a8 = FVar7.size;
    inline_assertion_check<false,bool>
              ((bool *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               (char *)in_stack_fffffffffffffde0,
               CONCAT13(in_stack_fffffffffffffddf,
                        CONCAT12(in_stack_fffffffffffffdde,
                                 CONCAT11(in_stack_fffffffffffffddd,in_stack_fffffffffffffddc))),
               (char *)CONCAT44(in_stack_fffffffffffffdd4,
                                CONCAT13(in_stack_fffffffffffffdd3,
                                         CONCAT12(in_stack_fffffffffffffdd2,
                                                  CONCAT11(in_stack_fffffffffffffdd1,
                                                           in_stack_fffffffffffffdd0)))),
               (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    if ((bVar5) || (bVar6)) {
      in_stack_fffffffffffffddf = bVar5 && bVar6;
      inline_assertion_check<false,bool>
                ((bool *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                 (char *)in_stack_fffffffffffffde0,
                 CONCAT13(in_stack_fffffffffffffddf,
                          CONCAT12(in_stack_fffffffffffffdde,
                                   CONCAT11(in_stack_fffffffffffffddd,in_stack_fffffffffffffddc))),
                 (char *)CONCAT44(in_stack_fffffffffffffdd4,
                                  CONCAT13(in_stack_fffffffffffffdd3,
                                           CONCAT12(in_stack_fffffffffffffdd2,
                                                    CONCAT11(in_stack_fffffffffffffdd1,
                                                             in_stack_fffffffffffffdd0)))),
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      FeeFrac::FeeFrac((FeeFrac *)
                       CONCAT17(in_stack_fffffffffffffddf,
                                CONCAT16(in_stack_fffffffffffffdde,
                                         CONCAT15(in_stack_fffffffffffffddd,
                                                  CONCAT14(in_stack_fffffffffffffddc,
                                                           in_stack_fffffffffffffdd8)))),
                       CONCAT44(in_stack_fffffffffffffdd4,
                                CONCAT13(in_stack_fffffffffffffdd3,
                                         CONCAT12(in_stack_fffffffffffffdd2,
                                                  CONCAT11(in_stack_fffffffffffffdd1,
                                                           in_stack_fffffffffffffdd0)))),
                       in_stack_fffffffffffffdcc);
      FeeRateCompare(in_stack_fffffffffffffe20,
                     (FeeFrac *)
                     CONCAT17(in_stack_fffffffffffffe1f._M_value,
                              CONCAT16(in_stack_fffffffffffffe1e._M_value,in_stack_fffffffffffffe18)
                             ));
    }
    else {
      FVar7 = CompareChunks::anon_class_24_3_8dde4389::operator()
                        ((anon_class_24_3_8dde4389 *)
                         CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                         (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
      local_d0[0].fee = FVar7.fee;
      local_d0[0].size = FVar7.size;
      in_stack_fffffffffffffe20 = local_d0;
      FVar7 = operator-((FeeFrac *)
                        CONCAT17(in_stack_fffffffffffffddf,
                                 CONCAT16(in_stack_fffffffffffffdde,
                                          CONCAT15(in_stack_fffffffffffffddd,
                                                   CONCAT14(in_stack_fffffffffffffddc,
                                                            in_stack_fffffffffffffdd8)))),
                        (FeeFrac *)
                        CONCAT44(in_stack_fffffffffffffdd4,
                                 CONCAT13(in_stack_fffffffffffffdd3,
                                          CONCAT12(in_stack_fffffffffffffdd2,
                                                   CONCAT11(in_stack_fffffffffffffdd1,
                                                            in_stack_fffffffffffffdd0)))));
      local_e0 = FVar7.fee;
      local_d8 = FVar7.size;
      inline_assertion_check<false,bool>
                ((bool *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                 (char *)in_stack_fffffffffffffde0,
                 CONCAT13(in_stack_fffffffffffffddf,
                          CONCAT12(in_stack_fffffffffffffdde,
                                   CONCAT11(in_stack_fffffffffffffddd,in_stack_fffffffffffffddc))),
                 (char *)CONCAT44(in_stack_fffffffffffffdd4,
                                  CONCAT13(in_stack_fffffffffffffdd3,
                                           CONCAT12(in_stack_fffffffffffffdd2,
                                                    CONCAT11(in_stack_fffffffffffffdd1,
                                                             in_stack_fffffffffffffdd0)))),
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      FeeRateCompare(in_stack_fffffffffffffe20,
                     (FeeFrac *)
                     CONCAT17(in_stack_fffffffffffffe1f._M_value,
                              CONCAT16(in_stack_fffffffffffffe1e._M_value,in_stack_fffffffffffffe18)
                             ));
      if (in_stack_fffffffffffffe20->size == local_88) {
        CompareChunks::anon_class_24_3_20bf67a9::operator()
                  ((anon_class_24_3_20bf67a9 *)
                   CONCAT17(in_stack_fffffffffffffddf,
                            CONCAT16(in_stack_fffffffffffffdde,
                                     CONCAT15(in_stack_fffffffffffffddd,
                                              CONCAT14(in_stack_fffffffffffffddc,
                                                       in_stack_fffffffffffffdd8)))),
                   in_stack_fffffffffffffdd4);
      }
    }
    in_stack_fffffffffffffe1f =
         std::weak_ordering::operator_cast_to_partial_ordering
                   ((weak_ordering *)
                    CONCAT44(in_stack_fffffffffffffdd4,
                             CONCAT13(in_stack_fffffffffffffdd3,
                                      CONCAT12(in_stack_fffffffffffffdd2,
                                               CONCAT11(in_stack_fffffffffffffdd1,
                                                        in_stack_fffffffffffffdd0)))));
    bVar5 = std::is_gt((partial_ordering)(type)((uint)in_stack_fffffffffffffdcc >> 0x18));
    if (bVar5) {
      local_5a[(int)uVar1] = 1;
    }
    in_stack_fffffffffffffe1e =
         std::weak_ordering::operator_cast_to_partial_ordering
                   ((weak_ordering *)
                    CONCAT44(in_stack_fffffffffffffdd4,
                             CONCAT13(in_stack_fffffffffffffdd3,
                                      CONCAT12(in_stack_fffffffffffffdd2,
                                               CONCAT11(in_stack_fffffffffffffdd1,
                                                        in_stack_fffffffffffffdd0)))));
    bVar5 = std::is_lt((partial_ordering)(type)((uint)in_stack_fffffffffffffdcc >> 0x18));
    if (bVar5) {
      local_5a[(uVar1 != 0 ^ 0xffU) & 1] = 1;
    }
    CompareChunks::anon_class_24_3_20bf67a9::operator()
              ((anon_class_24_3_20bf67a9 *)
               CONCAT17(in_stack_fffffffffffffddf,
                        CONCAT16(in_stack_fffffffffffffdde,
                                 CONCAT15(in_stack_fffffffffffffddd,
                                          CONCAT14(in_stack_fffffffffffffddc,
                                                   in_stack_fffffffffffffdd8)))),
               in_stack_fffffffffffffdd4);
  } while (((local_5a[0] & 1) == 0) || ((local_5a[1] & 1) == 0));
  local_e1 = '\x02';
LAB_01ab852a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (partial_ordering)local_e1;
}

Assistant:

std::partial_ordering CompareChunks(Span<const FeeFrac> chunks0, Span<const FeeFrac> chunks1)
{
    /** Array to allow indexed access to input diagrams. */
    const std::array<Span<const FeeFrac>, 2> chunk = {chunks0, chunks1};
    /** How many elements we have processed in each input. */
    size_t next_index[2] = {0, 0};
    /** Accumulated fee/sizes in diagrams, up to next_index[i] - 1. */
    FeeFrac accum[2];
    /** Whether the corresponding input is strictly better than the other at least in one place. */
    bool better_somewhere[2] = {false, false};
    /** Get the first unprocessed point in diagram number dia. */
    const auto next_point = [&](int dia) { return chunk[dia][next_index[dia]] + accum[dia]; };
    /** Get the last processed point in diagram number dia. */
    const auto prev_point = [&](int dia) { return accum[dia]; };
    /** Move to the next point in diagram number dia. */
    const auto advance = [&](int dia) { accum[dia] += chunk[dia][next_index[dia]++]; };

    do {
        bool done_0 = next_index[0] == chunk[0].size();
        bool done_1 = next_index[1] == chunk[1].size();
        if (done_0 && done_1) break;

        // Determine which diagram has the first unprocessed point. If a single side is finished, use the
        // other one. Only up to one can be done due to check above.
        const int unproc_side = (done_0 || done_1) ? done_0 : next_point(0).size > next_point(1).size;

        // Let `P` be the next point on diagram unproc_side, and `A` and `B` the previous and next points
        // on the other diagram. We want to know if P lies above or below the line AB. To determine this, we
        // compute the slopes of line AB and of line AP, and compare them. These slopes are fee per size,
        // and can thus be expressed as FeeFracs.
        const FeeFrac& point_p = next_point(unproc_side);
        const FeeFrac& point_a = prev_point(!unproc_side);

        const auto slope_ap = point_p - point_a;
        Assume(slope_ap.size > 0);
        std::weak_ordering cmp = std::weak_ordering::equivalent;
        if (done_0 || done_1) {
            // If a single side has no points left, act as if AB has slope tail_feerate(of 0).
            Assume(!(done_0 && done_1));
            cmp = FeeRateCompare(slope_ap, FeeFrac(0, 1));
        } else {
            // If both sides have points left, compute B, and the slope of AB explicitly.
            const FeeFrac& point_b = next_point(!unproc_side);
            const auto slope_ab = point_b - point_a;
            Assume(slope_ab.size >= slope_ap.size);
            cmp = FeeRateCompare(slope_ap, slope_ab);

            // If B and P have the same size, B can be marked as processed (in addition to P, see
            // below), as we've already performed a comparison at this size.
            if (point_b.size == point_p.size) advance(!unproc_side);
        }
        // If P lies above AB, unproc_side is better in P. If P lies below AB, then !unproc_side is
        // better in P.
        if (std::is_gt(cmp)) better_somewhere[unproc_side] = true;
        if (std::is_lt(cmp)) better_somewhere[!unproc_side] = true;
        advance(unproc_side);

        // If both diagrams are better somewhere, they are incomparable.
        if (better_somewhere[0] && better_somewhere[1]) return std::partial_ordering::unordered;
    } while(true);

    // Otherwise compare the better_somewhere values.
    return better_somewhere[0] <=> better_somewhere[1];
}